

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) == 0) {
    sVar2 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      lVar3 = 0;
    }
    else {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      lVar3 = sVar2 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->input_type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      lVar3 = lVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->output_type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      lVar3 = lVar3 + sVar2 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>(this->options_)
      ;
      lVar3 = lVar3 + sVar2 + 1;
    }
    sVar2 = (ulong)((uVar1 >> 4 & 2) + (uVar1 >> 3 & 2)) + lVar3;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar2,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t MethodDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string input_type = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_type());
    }

    // optional string output_type = 3;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_output_type());
    }

    // optional .google.protobuf.MethodOptions options = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional bool client_streaming = 5 [default = false];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool server_streaming = 6 [default = false];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}